

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O3

SRes crnlib::LzmaEnc_CodeOneMemBlock
               (CLzmaEncHandle pp,Bool reInit,Byte *dest,size_t *destLen,UInt32 desiredPackSize,
               UInt32 *unpackSize)

{
  int iVar1;
  SRes SVar2;
  CSeqOutStreamBuf outStream;
  code *local_50;
  Byte *local_48;
  size_t local_40;
  int local_38;
  
  local_50 = MyWrite;
  local_40 = *destLen;
  local_38 = 0;
  *(undefined4 *)((long)pp + 0x3d330) = 0;
  *(undefined4 *)((long)pp + 0x3d344) = 0;
  *(undefined4 *)((long)pp + 0x3d34c) = 0;
  local_48 = dest;
  if (reInit != 0) {
    LzmaEnc_Init((CLzmaEnc *)pp);
  }
  LzmaEnc_InitPrices((CLzmaEnc *)pp);
  iVar1 = *(int *)((long)pp + 0x3d338);
  *(undefined8 *)((long)pp + 0x3d2f0) = 0;
  *(undefined4 *)((long)pp + 0x3d2e8) = 0xffffffff;
  *(undefined8 *)((long)pp + 0x3d2f8) = 1;
  *(undefined1 *)((long)pp + 0x3d2ec) = 0;
  *(undefined8 *)((long)pp + 0x3d300) = *(undefined8 *)((long)pp + 0x3d310);
  *(undefined8 *)((long)pp + 0x3d320) = 0;
  *(undefined4 *)((long)pp + 0x3d328) = 0;
  *(code ***)((long)pp + 0x3d318) = &local_50;
  SVar2 = LzmaEnc_CodeOneBlock((CLzmaEnc *)pp,1,desiredPackSize,*unpackSize);
  *unpackSize = *(int *)((long)pp + 0x3d338) - iVar1;
  *destLen = *destLen - local_40;
  if (local_38 != 0) {
    SVar2 = 7;
  }
  return SVar2;
}

Assistant:

SRes LzmaEnc_CodeOneMemBlock(CLzmaEncHandle pp, Bool reInit,
                             Byte* dest, size_t* destLen, UInt32 desiredPackSize, UInt32* unpackSize) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  UInt64 nowPos64;
  SRes res;
  CSeqOutStreamBuf outStream;

  outStream.funcTable.Write = MyWrite;
  outStream.data = dest;
  outStream.rem = *destLen;
  outStream.overflow = False;

  p->writeEndMark = False;
  p->finished = False;
  p->result = SZ_OK;

  if (reInit)
    LzmaEnc_Init(p);
  LzmaEnc_InitPrices(p);
  nowPos64 = p->nowPos64;
  RangeEnc_Init(&p->rc);
  p->rc.outStream = &outStream.funcTable;

  res = LzmaEnc_CodeOneBlock(p, True, desiredPackSize, *unpackSize);

  *unpackSize = (UInt32)(p->nowPos64 - nowPos64);
  *destLen -= outStream.rem;
  if (outStream.overflow)
    return SZ_ERROR_OUTPUT_EOF;

  return res;
}